

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
helics::Input::getValue_impl<std::__cxx11::string>(void *param_1,Input *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string(in_stack_ffffffffffffffd0);
  getValue_impl<std::__cxx11::string>(param_2,param_1);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_1;
}

Assistant:

X getValue_impl(std::integral_constant<int, primaryType> /*V*/)
    {
        X val;  // NOLINT
        getValue_impl(std::integral_constant<int, primaryType>(), val);
        return val;
    }